

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dense.hpp
# Opt level: O2

void __thiscall
remora::
dense_matrix_adaptor<double,_remora::row_major,_remora::continuous_dense_tag,_remora::cpu_tag>::
clear(dense_matrix_adaptor<double,_remora::row_major,_remora::continuous_dense_tag,_remora::cpu_tag>
      *this)

{
  size_type sVar1;
  size_type sVar2;
  size_type sVar3;
  double *pdVar4;
  long lVar5;
  size_type i;
  size_type sVar6;
  size_type sVar7;
  
  sVar1 = this->m_size1;
  sVar2 = this->m_size2;
  lVar5 = 0;
  for (sVar6 = 0; sVar6 != sVar1; sVar6 = sVar6 + 1) {
    sVar3 = this->m_leading_dimension;
    pdVar4 = this->m_values;
    for (sVar7 = 0; sVar2 != sVar7; sVar7 = sVar7 + 1) {
      *(undefined8 *)((long)pdVar4 + sVar7 * 8 + sVar3 * lVar5) = 0;
    }
    lVar5 = lVar5 + 8;
  }
  return;
}

Assistant:

void clear(){
		for(size_type i = 0; i != major_size(*this); ++i){
			for(size_type j = 0; j != minor_size(*this); ++j){
				m_values[i * m_leading_dimension + j] = value_type();
			}
		}
	}